

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

string * cpp_bindgen::wrap_line(string *__return_storage_ptr__,string *line,string *prefix)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  difference_type dVar2;
  reference pcVar3;
  runtime_error *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  char *local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  next_it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  const_iterator it;
  string current_prefix;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string line_divider;
  string *prefix_local;
  string *line_local;
  string *ret;
  
  line_divider.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40," &",&local_41);
  std::allocator<char>::~allocator(&local_41);
  current_prefix.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",
             (allocator<char> *)(current_prefix.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(current_prefix.field_2._M_local_buf + 10));
  std::__cxx11::string::string((string *)&it,(string *)line_divider.field_2._8_8_);
  local_80._M_current = (char *)std::__cxx11::string::begin();
  do {
    local_90 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_80,0x84);
    dVar2 = std::__cxx11::string::size();
    local_88 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_90,dVar2);
    next_it._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(&local_88,&next_it);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&it);
      __first._M_current = local_80._M_current;
      __last._M_current = (char *)std::__cxx11::string::end();
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,__first,__last);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
      current_prefix.field_2._M_local_buf[0xb] = '\x01';
      std::__cxx11::string::~string((string *)&it);
      if ((current_prefix.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    local_b0 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_80,0x84);
    dVar2 = std::__cxx11::string::size();
    local_a8 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_b0,dVar2);
    dVar2 = std::__cxx11::string::size();
    local_a0 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_a8,dVar2);
    while( true ) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_a0,1);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_b8);
      if (*pcVar3 == ',') break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(&local_a0);
      local_c8._M_current = (char *)std::__cxx11::string::begin();
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_c8,1);
      bVar1 = __gnu_cxx::operator==(&local_a0,&local_c0);
      if (bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Too long line cannot be wrapped");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    local_d0 = local_80._M_current;
    local_d8 = local_a0._M_current;
    std::__cxx11::string::
    append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,local_80,local_a0);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f8);
    local_80._M_current = local_a0._M_current;
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   line_divider.field_2._8_8_,"   ");
    std::__cxx11::string::operator=((string *)&it,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  } while( true );
}

Assistant:

std::string wrap_line(const std::string &line, const std::string &prefix) {
        static constexpr unsigned int max_line_length = 132;
        const std::string line_divider = " &";
        std::string ret = "";
        std::string current_prefix = prefix;

        auto it = line.begin();
        while (it + max_line_length - current_prefix.size() < line.end()) {
            auto next_it = it + max_line_length - line_divider.size() - current_prefix.size();
            while (*(next_it - 1) != ',') {
                --next_it;
                if (next_it == line.begin() + 1)
                    throw std::runtime_error("Too long line cannot be wrapped");
            }

            ret.append(current_prefix);
            ret.append(it, next_it);
            ret.append(line_divider + "\n");

            it = next_it;
            // more indentation on next line
            current_prefix = prefix + "   ";
        }
        ret += current_prefix;
        ret.append(it, line.end());
        ret += '\n';
        return ret;
    }